

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O2

iterator __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::FindMacroDefinition
          (ConversionStream *this,string *MacroName)

{
  long *plVar1;
  _List_node_base *p_Var2;
  bool bVar3;
  iterator iVar4;
  long lVar5;
  _List_node_base *p_Var6;
  HashMapStringKey local_30;
  
  HashMapStringKey::HashMapStringKey(&local_30,(MacroName->_M_dataplus)._M_p,false);
  iVar4 = std::
          _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->m_PreprocessorDefinitions)._M_h,&local_30);
  HashMapStringKey::Clear(&local_30);
  if (iVar4.
      super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    p_Var6 = (_List_node_base *)&this->m_Tokens;
  }
  else {
    plVar1 = (long *)**(long **)((long)iVar4.
                                       super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>,_false>
                                       ._M_cur + 0x18);
    p_Var6 = (_List_node_base *)&this->m_Tokens;
    if (((((_List_node_base *)plVar1 != p_Var6) &&
         (bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(plVar1 + 3),MacroName), !bVar3)) &&
        (p_Var2 = (_List_node_base *)*plVar1, p_Var2 != p_Var6)) &&
       (lVar5 = std::__cxx11::string::find_first_of((char *)&p_Var2[3]._M_prev,0x2d07b8),
       lVar5 == -1)) {
      if (*(int *)&p_Var2[1]._M_next - 1U < 0xbf) {
        p_Var6 = p_Var2;
      }
      if (*(int *)&p_Var2[1]._M_next == 0x13b) {
        p_Var6 = p_Var2;
      }
    }
  }
  return (iterator)p_Var6;
}

Assistant:

HLSL2GLSLConverterImpl::TokenListType::iterator HLSL2GLSLConverterImpl::ConversionStream::FindMacroDefinition(const std::string& MacroName)
{
    auto define_it = m_PreprocessorDefinitions.find(MacroName.c_str());
    if (define_it == m_PreprocessorDefinitions.end())
        return m_Tokens.end();

    auto Token = define_it->second;
    // #define PS_OUTPUT PSOutput
    // ^

    ++Token;
    // #define PS_OUTPUT PSOutput
    //         ^
    if (Token == m_Tokens.end() || Token->Literal != MacroName)
        return m_Tokens.end();

    ++Token;
    // #define PS_OUTPUT PSOutput
    //                   ^

    // Check that the definition is on the same line (we don't handle multiline definitions)
    if (Token == m_Tokens.end() || Token->Delimiter.find_first_of("\r\n") != std::string::npos)
        return m_Tokens.end();

    return (Token->IsBuiltInType() || Token->Type == TokenType::Identifier) ? Token : m_Tokens.end();
}